

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gravity_value.c
# Opt level: O2

void gravity_class_free_internal(gravity_vm *vm,gravity_class_t *c,_Bool skip_base)

{
  _Bool _Var1;
  gravity_delegate_t *pgVar2;
  undefined7 in_register_00000011;
  
  if ((int)CONCAT71(in_register_00000011,skip_base) != 0) {
    _Var1 = gravity_iscore_class(c);
    if (!_Var1) {
      _Var1 = gravity_isopt_class(c);
      if (!_Var1) goto LAB_00129980;
    }
    return;
  }
LAB_00129980:
  if ((vm != (gravity_vm *)0x0) && (c->xdata != (void *)0x0)) {
    pgVar2 = gravity_vm_delegate(vm);
    if (pgVar2->bridge_free != (gravity_bridge_free)0x0) {
      (*pgVar2->bridge_free)(vm,c);
    }
  }
  free(c->identifier);
  free(c->superlook);
  if (!skip_base) {
    gravity_hash_iterate(c->htable,gravity_hash_interalfree,(void *)0x0);
    gravity_hash_iterate(c->htable,gravity_hash_valuefree,(void *)0x0);
  }
  gravity_hash_free(c->htable);
  free(c->ivars);
  free(c);
  return;
}

Assistant:

static void gravity_class_free_internal (gravity_vm *vm, gravity_class_t *c, bool skip_base) {
    if (skip_base && (gravity_iscore_class(c) || gravity_isopt_class(c))) return;

    DEBUG_FREE("FREE %s", gravity_object_debug((gravity_object_t *)c, true));

    // check if bridged data needs to be freed too
    if (c->xdata && vm) {
        gravity_delegate_t *delegate = gravity_vm_delegate(vm);
        if (delegate->bridge_free) delegate->bridge_free(vm, (gravity_object_t *)c);
    }

    if (c->identifier) mem_free((void *)c->identifier);
    if (c->superlook) mem_free((void *)c->superlook);
    
    if (!skip_base) {
        // base classes have functions not registered inside VM so manually free all of them
        gravity_hash_iterate(c->htable, gravity_hash_interalfree, NULL);
        gravity_hash_iterate(c->htable, gravity_hash_valuefree, NULL);
    }

    gravity_hash_free(c->htable);
    if (c->ivars) mem_free((void *)c->ivars);
    mem_free((void *)c);
}